

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall
SWDSimulationDataGenerator::OutputWriteBit(SWDSimulationDataGenerator *this,BitState state)

{
  uint uVar1;
  
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mSWDIO);
  uVar1 = (int)this + 0x18;
  ClockGenerator::AdvanceByTimeS(3e-07);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByTimeS(4e-07);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByTimeS(3e-07);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  return;
}

Assistant:

void SWDSimulationDataGenerator::OutputWriteBit( BitState state )
{
    mSWDIO->TransitionIfNeeded( state );

    AdvanceAllBySec( TENTH_US * 3 );

    mSWCLK->Transition(); // CLK goes high
    AdvanceAllBySec( TENTH_US * 4 );
    mSWCLK->Transition(); // CLK goes low

    AdvanceAllBySec( TENTH_US * 3 );
}